

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O2

bool __thiscall V4L2Device::write_jpeg(V4L2Device *this,v4l2_buffer *bufferinfo)

{
  uint uVar1;
  Options *this_00;
  OptionDetails *this_01;
  bool *pbVar2;
  Writer *pWVar3;
  int *piVar4;
  bool bVar5;
  bool ok;
  RawImagePtr image;
  string jpeg_file_name;
  undefined1 local_2a8 [16];
  char *local_298;
  LineNumber local_290;
  char *local_288;
  VerboseLevel local_280;
  Logger *local_278;
  bool local_270;
  Logger *local_268;
  char *local_260;
  DispatchAction local_258;
  pointer local_250;
  pointer pbStack_248;
  pointer local_240;
  fstream result;
  char *local_228 [2];
  char *local_218;
  VerboseLevel local_210;
  Logger *local_208;
  bool local_200;
  Logger *local_1f8;
  char *local_1f0;
  DispatchAction local_1e8;
  pointer local_1e0;
  pointer pbStack_1d8;
  pointer local_1d0;
  
  uVar1 = bufferinfo->index;
  make_jpeg_file_name_abi_cxx11_(&jpeg_file_name,this);
  if (jpeg_file_name._M_string_length == 0) {
    _result = &PTR__Writer_00176078;
    local_228[0] = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
    ;
    local_228[1] = (char *)0x1c0;
    local_218 = "bool V4L2Device::write_jpeg(const struct v4l2_buffer &)";
    local_210 = 0;
    local_208 = (Logger *)0x0;
    local_200 = false;
    local_1f8 = (Logger *)0x0;
    local_1f0 = "";
    local_1e8 = NormalLog;
    local_1e0 = (pointer)0x0;
    pbStack_1d8 = (pointer)0x0;
    local_1d0 = (pointer)0x0;
    pWVar3 = el::base::Writer::construct((Writer *)&result,1,"default");
    el::base::Writer::operator<<(pWVar3,(char (*) [33])"couldn\'t create result file name");
    el::base::Writer::~Writer((Writer *)&result);
    bVar5 = false;
    goto LAB_00152b2f;
  }
  this_00 = (this->options).super___shared_ptr<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string((string *)&result,"save-jpeg-asis",(allocator *)local_2a8);
  this_01 = cxxopts::Options::operator[](this_00,(string *)&result);
  pbVar2 = cxxopts::OptionDetails::as<bool>(this_01);
  bVar5 = *pbVar2;
  std::__cxx11::string::~string((string *)&result);
  if (bVar5 == true) {
    std::fstream::fstream(&result,(string *)&jpeg_file_name,_S_trunc|_S_out|_S_bin);
    bVar5 = (*(byte *)((long)&local_218 + (long)*(undefined **)((long)_result + -0x18)) & 5) == 0;
    if (bVar5) {
      std::ostream::write((char *)local_228,(long)(this->buffers)._M_elems[uVar1].start);
    }
    else {
      local_2a8._0_8_ = &PTR__Writer_00176078;
      local_2a8._8_2_ = 0x10;
      local_298 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
      ;
      local_290 = 0x1c8;
      local_288 = "bool V4L2Device::write_jpeg(const struct v4l2_buffer &)";
      local_280 = 0;
      local_278 = (Logger *)0x0;
      local_270 = false;
      local_268 = (Logger *)0x0;
      local_260 = "";
      local_258 = NormalLog;
      local_250 = (pointer)0x0;
      pbStack_248 = (pointer)0x0;
      local_240 = (pointer)0x0;
      pWVar3 = el::base::Writer::construct((Writer *)local_2a8,1,"default");
      pWVar3 = el::base::Writer::operator<<(pWVar3,(char (*) [19])"open file failed: ");
      piVar4 = __errno_location();
      image._M_t.
      super___uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>._M_t.
      super__Tuple_impl<0UL,_V4L2Device::RawImage_*,_std::default_delete<V4L2Device::RawImage>_>.
      super__Head_base<0UL,_V4L2Device::RawImage_*,_false>._M_head_impl =
           (__uniq_ptr_data<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>,_true,_true>
            )strerror(*piVar4);
      el::base::Writer::operator<<(pWVar3,(char **)&image);
      el::base::Writer::~Writer((Writer *)local_2a8);
    }
    std::fstream::~fstream(&result);
    goto LAB_00152b2f;
  }
  image._M_t.super___uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>
  ._M_t.super__Tuple_impl<0UL,_V4L2Device::RawImage_*,_std::default_delete<V4L2Device::RawImage>_>.
  super__Head_base<0UL,_V4L2Device::RawImage_*,_false>._M_head_impl =
       (__uniq_ptr_data<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>,_true,_true>
       )(__uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>)0x0;
  decompress_jpeg((V4L2Device *)&result,(v4l2_buffer *)this);
  local_2a8._0_8_ = &image;
  local_2a8._8_8_ = &ok;
  std::tuple<bool&,std::unique_ptr<V4L2Device::RawImage,std::default_delete<V4L2Device::RawImage>>&>
  ::operator=((tuple<bool&,std::unique_ptr<V4L2Device::RawImage,std::default_delete<V4L2Device::RawImage>>&>
               *)local_2a8,
              (tuple<bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
               *)&result);
  std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>::~unique_ptr
            ((unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_> *)&result
            );
  if (ok == false) {
    _result = &PTR__Writer_00176078;
    local_228[0] = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
    ;
    local_228[1] = (char *)0x1de;
    local_218 = "bool V4L2Device::write_jpeg(const struct v4l2_buffer &)";
    local_210 = 0;
    local_208 = (Logger *)0x0;
    local_200 = false;
    local_1f8 = (Logger *)0x0;
    local_1f0 = "";
    local_1e8 = NormalLog;
    local_1e0 = (pointer)0x0;
    pbStack_1d8 = (pointer)0x0;
    local_1d0 = (pointer)0x0;
    pWVar3 = el::base::Writer::construct((Writer *)&result,1,"default");
    el::base::Writer::operator<<(pWVar3,(char (*) [28])"image decompression failed!");
LAB_00152aeb:
    el::base::Writer::~Writer((Writer *)&result);
    bVar5 = false;
  }
  else {
    ok = compress_jpeg(this,&image,&jpeg_file_name);
    bVar5 = true;
    if (!ok) {
      _result = &PTR__Writer_00176078;
      local_228[0] = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
      ;
      local_228[1] = (char *)0x1e4;
      local_218 = "bool V4L2Device::write_jpeg(const struct v4l2_buffer &)";
      local_210 = 0;
      local_208 = (Logger *)0x0;
      local_200 = false;
      local_1f8 = (Logger *)0x0;
      local_1f0 = "";
      local_1e8 = NormalLog;
      local_1e0 = (pointer)0x0;
      pbStack_1d8 = (pointer)0x0;
      local_1d0 = (pointer)0x0;
      pWVar3 = el::base::Writer::construct((Writer *)&result,1,"default");
      el::base::Writer::operator<<(pWVar3,(char (*) [26])"image compression failed!");
      goto LAB_00152aeb;
    }
  }
  std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>::~unique_ptr
            (&image);
LAB_00152b2f:
  std::__cxx11::string::~string((string *)&jpeg_file_name);
  return bVar5;
}

Assistant:

bool
    write_jpeg(const struct v4l2_buffer& bufferinfo)
    {
        auto idx = bufferinfo.index;

        auto jpeg_file_name = make_jpeg_file_name();
        if (jpeg_file_name.empty()) {
            LOG(ERROR) << "couldn't create result file name";
            return false;
        }

        auto save_jpeg_asis = (*options)["save-jpeg-asis"].as<bool>();
        if (save_jpeg_asis) { // store jpeg as we have received it from the camera
            std::fstream result(jpeg_file_name, std::ios::binary | std::ios::out | std::ios::trunc);
            if (result.fail()) {
                LOG(ERROR) << "open file failed: " << strerror(errno);
                return false;
            }

            try {
                result.write(static_cast<const char*>(buffers[idx].start), bufferinfo.length);
            } catch (std::exception& exc) {
                LOG(ERROR) << "write file failed: " << exc.what();
                return false;
            }

            return true;
        }

        // (Re)compress JPEG

        bool ok;
        RawImagePtr image;

        try {
            std::tie(ok, image) = decompress_jpeg(bufferinfo);
            if (not ok) {
                LOG(ERROR) << "image decompression failed!";
                return false;
            }

            ok = compress_jpeg(image, jpeg_file_name);
            if (not ok) {
                LOG(ERROR) << "image compression failed!";
                return false;
            }
        } catch (std::exception& exc) {
            LOG(WARNING) << "image (de)compression failed: " << exc.what();
            return false;
        }

        return true;
    }